

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void absFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  ulong val;
  double dVar1;
  double val_00;
  
  pMem = *argv;
  if (pMem->type == '\x05') {
    sqlite3VdbeMemSetNull(&context->s);
    return;
  }
  if (pMem->type == '\x01') {
    val = sqlite3VdbeIntValue(pMem);
    if ((long)val < 0) {
      if ((val & 0x7fffffffffffffff) == 0) {
        sqlite3_result_error(context,"integer overflow",-1);
        return;
      }
      val = -val;
    }
    sqlite3VdbeMemSetInt64(&context->s,val);
    return;
  }
  dVar1 = sqlite3VdbeRealValue(pMem);
  val_00 = -dVar1;
  if (-dVar1 <= dVar1) {
    val_00 = dVar1;
  }
  sqlite3VdbeMemSetDouble(&context->s,val_00);
  return;
}

Assistant:

static void absFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: {
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal<0 ){
        if( (iVal<<1)==0 ){
          /* IMP: R-35460-15084 If X is the integer -9223372036854775807 then
          ** abs(X) throws an integer overflow error since there is no
          ** equivalent positive 64-bit two complement value. */
          sqlite3_result_error(context, "integer overflow", -1);
          return;
        }
        iVal = -iVal;
      } 
      sqlite3_result_int64(context, iVal);
      break;
    }
    case SQLITE_NULL: {
      /* IMP: R-37434-19929 Abs(X) returns NULL if X is NULL. */
      sqlite3_result_null(context);
      break;
    }
    default: {
      /* Because sqlite3_value_double() returns 0.0 if the argument is not
      ** something that can be converted into a number, we have:
      ** IMP: R-57326-31541 Abs(X) return 0.0 if X is a string or blob that
      ** cannot be converted to a numeric value. 
      */
      double rVal = sqlite3_value_double(argv[0]);
      if( rVal<0 ) rVal = -rVal;
      sqlite3_result_double(context, rVal);
      break;
    }
  }
}